

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_p.h
# Opt level: O2

void __thiscall QPaintEnginePrivate::updateSystemClip(QPaintEnginePrivate *this)

{
  QPaintEnginePrivate *this_00;
  QRegion QVar1;
  char cVar2;
  int iVar3;
  long in_FS_OFFSET;
  QRegion local_40;
  Representation local_38;
  Representation local_34;
  QRegion local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this + 0x20;
  QRegion::operator=((QRegion *)this_00,(QRegion *)(this + 0x18));
  cVar2 = QRegion::isEmpty();
  if (cVar2 == '\0') {
    if (((byte)this[0x98] & 1) != 0) {
      iVar3 = QTransform::type();
      if (iVar3 < 2) {
        QRegion::translate((int)this_00,
                           (int)((double)((ulong)*(double *)(this + 0x70) & 0x8000000000000000 |
                                         0x3fe0000000000000) + *(double *)(this + 0x70)));
      }
      else {
        QTransform::map(&local_40);
        QVar1.d = *(QRegionData **)this_00;
        *(QRegionData **)this_00 = local_40.d;
        local_40.d = QVar1.d;
        QRegion::~QRegion(&local_40);
      }
    }
    if (((byte)this[0x98] & 2) != 0) {
      QRegion::operator&=((QRegion *)this_00,(QRegion *)(this + 0x38));
      cVar2 = QRegion::isEmpty();
      if (cVar2 != '\0') {
        local_40.d = (QRegionData *)QRegion::boundingRect();
        local_38.m_i = (int)local_40.d;
        local_34.m_i = (int)((ulong)local_40.d >> 0x20);
        QRegion::QRegion(&local_30,(QRect *)&local_40,Rectangle);
        QVar1.d = *(QRegionData **)this_00;
        *(QRegionData **)this_00 = local_30.d;
        local_30.d = QVar1.d;
        QRegion::~QRegion(&local_30);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void updateSystemClip()
    {
        systemClip = baseSystemClip;
        if (systemClip.isEmpty())
            return;

        if (hasSystemTransform) {
            if (systemTransform.type() <= QTransform::TxTranslate)
                systemClip.translate(qRound(systemTransform.dx()), qRound(systemTransform.dy()));
            else
                systemClip = systemTransform.map(systemClip);
        }

        // Make sure we're inside the viewport.
        if (hasSystemViewport) {
            systemClip &= systemViewport;
            if (systemClip.isEmpty()) {
                // We don't want to paint without system clip, so set it to 1 pixel :)
                systemClip = QRect(systemViewport.boundingRect().topLeft(), QSize(1, 1));
            }
        }
    }